

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AppLayout.cpp
# Opt level: O2

IWindowPtr __thiscall cursespp::AppLayout::GetFocus(AppLayout *this)

{
  char cVar1;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_00;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_01;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var2;
  long in_RSI;
  IWindowPtr IVar3;
  
  cVar1 = (**(code **)(**(long **)(in_RSI + 0x260) + 0x120))();
  if (cVar1 == '\0') {
    if (*(long **)(in_RSI + 0x270) == (long *)0x0) {
      (this->super_LayoutBase).super_Window.super_IWindow.super_IOrderable._vptr_IOrderable =
           (_func_int **)0x0;
      (this->super_LayoutBase).super_Window.super_IWindow.super_IDisplayable._vptr_IDisplayable =
           (_func_int **)0x0;
      _Var2._M_pi = extraout_RDX;
    }
    else {
      (**(code **)(**(long **)(in_RSI + 0x270) + 0x1d0))(this);
      _Var2._M_pi = extraout_RDX_01;
    }
  }
  else {
    std::__shared_ptr<cursespp::IWindow,(__gnu_cxx::_Lock_policy)2>::
    __shared_ptr<cursespp::ShortcutsWindow,void>
              ((__shared_ptr<cursespp::IWindow,(__gnu_cxx::_Lock_policy)2> *)this,
               (__shared_ptr<cursespp::ShortcutsWindow,_(__gnu_cxx::_Lock_policy)2> *)
               (in_RSI + 0x260));
    _Var2._M_pi = extraout_RDX_00;
  }
  IVar3.super___shared_ptr<cursespp::IWindow,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       _Var2._M_pi;
  IVar3.super___shared_ptr<cursespp::IWindow,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)this;
  return (IWindowPtr)IVar3.super___shared_ptr<cursespp::IWindow,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

cursespp::IWindowPtr AppLayout::GetFocus() {
    if (this->shortcuts->IsFocused()) {
        return this->shortcuts;
    }
    if (this->layout) {
        return this->layout->GetFocus();
    }
    return cursespp::IWindowPtr();
}